

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void wallet::coinselector_tests::add_coin
               (CAmount *nValue,int nInput,SelectionResult *result,CAmount fee,CAmount long_term_fee
               )

{
  reference __args_2;
  long in_FS_OFFSET;
  undefined1 local_119;
  bool local_118 [5];
  undefined1 local_113;
  bool local_112;
  bool local_111;
  bool local_110 [4];
  int local_10c;
  shared_ptr<wallet::COutput> coin;
  CMutableTransaction tx;
  CAmount fee_local;
  OutputGroup group;
  pointer local_50;
  pointer psStack_48;
  pointer local_40;
  bool bStack_38;
  undefined7 uStack_37;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&tx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,(ulong)(nInput + 1));
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[(uint)nInput].nValue = *nValue;
  tx.nLockTime = nextLockTime;
  nextLockTime = nextLockTime + 1;
  CMutableTransaction::GetHash((Txid *)&local_50,&tx);
  group.m_outputs.
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_40;
  group.m_from_me = bStack_38;
  group._25_7_ = uStack_37;
  group.m_outputs.
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_50;
  group.m_outputs.
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psStack_48;
  group.m_value = CONCAT44(group.m_value._4_4_,nInput);
  __args_2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&tx.vout,(ulong)(uint)nInput);
  local_10c = 1;
  local_110[0] = true;
  local_110[1] = false;
  local_110[2] = false;
  local_110[3] = false;
  local_111 = true;
  local_112 = true;
  local_118[0] = false;
  local_118[1] = false;
  local_118[2] = false;
  local_118[3] = false;
  local_113 = 1;
  local_119 = 0;
  std::make_shared<wallet::COutput,COutPoint,CTxOut&,int,int,bool,bool,bool,int,bool,long&>
            ((COutPoint *)&coin,(CTxOut *)&group,(int *)__args_2,&local_10c,local_110,&local_111,
             &local_112,(int *)&local_113,local_118,(long *)&local_119);
  group.m_outputs.
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  group.m_outputs.
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  group.m_outputs.
  super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  group.m_from_me = true;
  group.m_value = 0;
  group.m_depth = 999;
  group.m_weight = 0;
  group.m_ancestors = 0;
  group.m_descendants = 0;
  group.effective_value = 0;
  group.fee = 0;
  group.long_term_fee = 0;
  group.m_long_term_feerate.nSatoshisPerK = 0;
  group.m_subtract_fee_outputs = false;
  OutputGroup::Insert(&group,&coin,0,0);
  (coin.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->long_term_fee =
       long_term_fee;
  SelectionResult::AddInput(result,&group);
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~vector(&group.m_outputs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&coin.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void add_coin(const CAmount& nValue, int nInput, SelectionResult& result, CAmount fee, CAmount long_term_fee)
{
    CMutableTransaction tx;
    tx.vout.resize(nInput + 1);
    tx.vout[nInput].nValue = nValue;
    tx.nLockTime = nextLockTime++;        // so all transactions get different hashes
    std::shared_ptr<COutput> coin = std::make_shared<COutput>(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ 148, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, fee);
    OutputGroup group;
    group.Insert(coin, /*ancestors=*/ 0, /*descendants=*/ 0);
    coin->long_term_fee = long_term_fee; // group.Insert() will modify long_term_fee, so we need to set it afterwards
    result.AddInput(group);
}